

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ReportLastSystemError(char *msg)

{
  string m;
  string sStack_58;
  char *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  cmStrCat<char_const*&,char_const(&)[17],std::__cxx11::string>
            (&sStack_58,&local_38,(char (*) [17])": System Error: ",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Error(&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}